

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3fShaderFragDataTests.cpp
# Opt level: O2

IterateResult __thiscall
deqp::gles3::Functional::anon_unknown_0::FragDataIndexingCase::iterate(FragDataIndexingCase *this)

{
  IndexExprType IVar1;
  RenderContext *renderCtx;
  code *pcVar2;
  bool bVar3;
  int iVar4;
  int iVar5;
  undefined4 uVar6;
  deUint32 dVar7;
  RGBA RVar8;
  undefined4 extraout_var;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  undefined4 extraout_var_02;
  TestError *this_00;
  long lVar9;
  int height;
  char *pcVar10;
  allocator<char> local_2db;
  allocator<char> local_2da;
  allocator<char> local_2d9;
  deUint8 indices [6];
  undefined1 local_2d0 [40];
  Surface result;
  float positions [8];
  float colors [16];
  string local_228;
  float indexValues [4];
  VertexArrayBinding vertexArrays [3];
  ShaderProgram program;
  
  renderCtx = ((this->super_TestCase).m_context)->m_renderCtx;
  iVar4 = (*renderCtx->_vptr_RenderContext[3])(renderCtx);
  lVar9 = CONCAT44(extraout_var,iVar4);
  IVar1 = this->m_indexExprType;
  if (IVar1 == INDEX_EXPR_STATIC) {
    pcVar10 = "0";
  }
  else if (IVar1 == INDEX_EXPR_UNIFORM) {
    pcVar10 = "u_index";
  }
  else {
    pcVar10 = (char *)0x0;
    if (IVar1 == INDEX_EXPR_DYNAMIC) {
      pcVar10 = "int(v_index)";
    }
  }
  memset(vertexArrays,0,0xac);
  vertexArrays[2].binding.name._M_string_length = 0;
  vertexArrays[2].binding.name.field_2._M_local_buf[0] = '\0';
  vertexArrays[2].binding.name.field_2._M_allocated_capacity._1_7_ = 0;
  vertexArrays[2].binding.name.field_2._M_local_buf[8] = '\0';
  vertexArrays[2].binding._33_8_ = 0;
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,
             "attribute highp vec4 a_position;\nattribute highp float a_index;\nattribute highp vec4 a_color;\nvarying mediump float v_index;\nvarying mediump vec4 v_color;\nvoid main (void)\n{\n\tgl_Position = a_position;\n\tv_color = a_color;\n\tv_index = a_index;\n}\n"
             ,(allocator<char> *)positions);
  glu::VertexSource::VertexSource((VertexSource *)colors,(string *)local_2d0);
  glu::ProgramSources::operator<<((ProgramSources *)vertexArrays,(ShaderSource *)colors);
  std::__cxx11::string::~string((string *)(colors + 2));
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&result,
             "varying mediump vec4 v_color;\nvarying mediump float v_index;\nuniform mediump int u_index;\nvoid main (void)\n{\n\tgl_FragData["
             ,(allocator<char> *)&local_228);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)positions,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&result,
                 pcVar10);
  std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_2d0,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)positions,
                 "] = v_color;\n}\n");
  glu::FragmentSource::FragmentSource((FragmentSource *)colors,(string *)local_2d0);
  glu::ProgramSources::operator<<((ProgramSources *)vertexArrays,(ShaderSource *)colors);
  std::__cxx11::string::~string((string *)(colors + 2));
  std::__cxx11::string::~string((string *)local_2d0);
  std::__cxx11::string::~string((string *)positions);
  std::__cxx11::string::~string((string *)&result);
  glu::ShaderProgram::ShaderProgram(&program,renderCtx,(ProgramSources *)vertexArrays);
  glu::ProgramSources::~ProgramSources((ProgramSources *)vertexArrays);
  iVar4 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar4 = *(int *)CONCAT44(extraout_var_00,iVar4);
  if (0x7f < iVar4) {
    iVar4 = 0x80;
  }
  iVar5 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
  iVar5 = *(int *)(CONCAT44(extraout_var_01,iVar5) + 4);
  height = 0x80;
  if (iVar5 < 0x80) {
    height = iVar5;
  }
  positions[4] = -1.0;
  positions[5] = 1.0;
  positions[6] = 1.0;
  positions[7] = 1.0;
  positions[0] = -1.0;
  positions[1] = -1.0;
  positions[2] = 1.0;
  positions[3] = -1.0;
  colors[0xc] = 0.0;
  colors[0xd] = 1.0;
  colors[0xe] = 0.0;
  colors[0xf] = 1.0;
  colors[8] = 0.0;
  colors[9] = 1.0;
  colors[10] = 0.0;
  colors[0xb] = 1.0;
  colors[4] = 0.0;
  colors[5] = 1.0;
  colors[6] = 0.0;
  colors[7] = 1.0;
  colors[0] = 0.0;
  colors[1] = 1.0;
  colors[2] = 0.0;
  colors[3] = 1.0;
  indexValues[0] = 0.0;
  indexValues[1] = 0.0;
  indexValues[2] = 0.0;
  indexValues[3] = 0.0;
  indices[4] = '\x01';
  indices[5] = '\x03';
  indices[0] = '\0';
  indices[1] = '\x01';
  indices[2] = '\x02';
  indices[3] = '\x02';
  std::__cxx11::string::string<std::allocator<char>>((string *)local_2d0,"a_position",&local_2d9);
  glu::va::Float(vertexArrays,(string *)local_2d0,2,4,0,positions);
  std::__cxx11::string::string<std::allocator<char>>((string *)&result,"a_color",&local_2da);
  glu::va::Float(vertexArrays + 1,(string *)&result,4,4,0,colors);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_228,"a_index",&local_2db);
  glu::va::Float(vertexArrays + 2,&local_228,1,4,0,indexValues);
  std::__cxx11::string::~string((string *)&local_228);
  std::__cxx11::string::~string((string *)&result);
  std::__cxx11::string::~string((string *)local_2d0);
  glu::operator<<(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->m_log,&program);
  if (program.m_program.m_info.linkOk != false) {
    (**(code **)(lVar9 + 0x1c0))(0x3f800000,0,0,0x3f800000);
    (**(code **)(lVar9 + 0x188))(0x4500);
    (**(code **)(lVar9 + 0x1a00))(0,0,iVar4,height);
    (**(code **)(lVar9 + 0x1680))(program.m_program.m_program);
    pcVar2 = *(code **)(lVar9 + 0x14f0);
    uVar6 = (**(code **)(lVar9 + 0xb48))(program.m_program.m_program,"u_index");
    (*pcVar2)(uVar6,0);
    local_2d0._0_4_ = R;
    local_2d0._4_4_ = UNORM_INT32;
    local_2d0._8_4_ = INDEXTYPE_UINT8;
    local_2d0._16_8_ = indices;
    glu::draw(renderCtx,program.m_program.m_program,3,vertexArrays,(PrimitiveList *)local_2d0,
              (DrawUtilCallback *)0x0);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Rendering failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xc5);
    tcu::Surface::Surface(&result,iVar4,height);
    iVar4 = (*renderCtx->_vptr_RenderContext[4])(renderCtx);
    RVar8 = tcu::PixelFormat::getColorThreshold
                      ((PixelFormat *)(CONCAT44(extraout_var_02,iVar4) + 8));
    local_2d0._0_4_ = RVar8.m_value;
    local_228._M_dataplus._M_p._0_4_ = 0x1010101;
    RVar8 = tcu::operator+((RGBA *)local_2d0,(RGBA *)&local_228);
    tcu::Surface::getAccess((PixelBufferAccess *)local_2d0,&result);
    glu::readPixels(renderCtx,0,0,(PixelBufferAccess *)local_2d0);
    dVar7 = (**(code **)(lVar9 + 0x800))();
    glu::checkError(dVar7,"Reading pixels failed",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
                    ,0xcd);
    bVar3 = compareSingleColor(((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx)->
                               m_log,&result,(RGBA)0xff00ff00,RVar8);
    pcVar10 = "Image comparison failed";
    if (bVar3) {
      pcVar10 = "Pass";
    }
    tcu::TestContext::setTestResult
              ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,(uint)!bVar3,pcVar10);
    tcu::Surface::~Surface(&result);
    lVar9 = 0xa8;
    do {
      std::__cxx11::string::~string((string *)((long)&vertexArrays[0].binding.type + lVar9));
      lVar9 = lVar9 + -0x50;
    } while (lVar9 != -0x48);
    glu::ShaderProgram::~ShaderProgram(&program);
    return STOP;
  }
  IVar1 = this->m_indexExprType;
  this_00 = (TestError *)__cxa_allocate_exception(0x38);
  if (IVar1 == INDEX_EXPR_STATIC) {
    tcu::TestError::TestError
              (this_00,"Compile failed",(char *)0x0,
               "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/functional/es3fShaderFragDataTests.cpp"
               ,0xb7);
    __cxa_throw(this_00,&tcu::TestError::typeinfo,tcu::Exception::~Exception);
  }
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)local_2d0,"Dynamic indexing of gl_FragData[] not supported",
             (allocator<char> *)&result);
  tcu::NotSupportedError::NotSupportedError((NotSupportedError *)this_00,(string *)local_2d0);
  __cxa_throw(this_00,&tcu::NotSupportedError::typeinfo,tcu::Exception::~Exception);
}

Assistant:

IterateResult iterate (void)
	{
		const glu::RenderContext&		renderCtx		= m_context.getRenderContext();
		const glw::Functions&			gl				= renderCtx.getFunctions();
		const glu::ShaderProgram		program			(renderCtx, genSources(m_indexExprType));
		const int						viewportW		= de::min(renderCtx.getRenderTarget().getWidth(), 128);
		const int						viewportH		= de::min(renderCtx.getRenderTarget().getHeight(), 128);

		const float positions[] =
		{
			-1.0f, -1.0f,
			+1.0f, -1.0f,
			-1.0f, +1.0f,
			+1.0f, +1.0f
		};
		const float colors[] =
		{
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f,
			0.0f, 1.0f, 0.0f, 1.0f
		};
		const float		indexValues[]	= { 0.0f, 0.0f, 0.0f, 0.0f };
		const deUint8	indices[]		= { 0, 1, 2, 2, 1, 3 };

		const glu::VertexArrayBinding vertexArrays[] =
		{
			glu::va::Float("a_position",	2, 4, 0, &positions[0]),
			glu::va::Float("a_color",		4, 4, 0, &colors[0]),
			glu::va::Float("a_index",		1, 4, 0, &indexValues[0])
		};

		m_testCtx.getLog() << program;

		if (!program.isOk())
		{
			if (m_indexExprType == INDEX_EXPR_STATIC)
				TCU_FAIL("Compile failed");
			else
				throw tcu::NotSupportedError("Dynamic indexing of gl_FragData[] not supported");
		}

		gl.clearColor	(1.0f, 0.0f, 0.0f, 1.0f);
		gl.clear		(GL_COLOR_BUFFER_BIT|GL_DEPTH_BUFFER_BIT|GL_STENCIL_BUFFER_BIT);

		gl.viewport		(0, 0, viewportW, viewportH);
		gl.useProgram	(program.getProgram());
		gl.uniform1i	(gl.getUniformLocation(program.getProgram(), "u_index"), 0);

		glu::draw(renderCtx, program.getProgram(), DE_LENGTH_OF_ARRAY(vertexArrays), &vertexArrays[0],
				  glu::pr::Triangles(DE_LENGTH_OF_ARRAY(indices), &indices[0]));
		GLU_EXPECT_NO_ERROR(gl.getError(), "Rendering failed");

		{
			tcu::Surface		result		(viewportW, viewportH);
			const tcu::RGBA		threshold	= renderCtx.getRenderTarget().getPixelFormat().getColorThreshold() + tcu::RGBA(1,1,1,1);
			bool				isOk;

			glu::readPixels(renderCtx, 0, 0, result.getAccess());
			GLU_EXPECT_NO_ERROR(gl.getError(), "Reading pixels failed");

			isOk = compareSingleColor(m_testCtx.getLog(), result, tcu::RGBA::green(), threshold);

			m_testCtx.setTestResult(isOk ? QP_TEST_RESULT_PASS	: QP_TEST_RESULT_FAIL,
									isOk ? "Pass"				: "Image comparison failed");
		}

		return STOP;
	}